

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O0

void ExpectPKCS12Parse(Span<const_unsigned_char> in,EVP_PKEY *expect_key,X509 *expect_cert,
                      vector<x509_st_*,_std::allocator<x509_st_*>_> *expect_ca_certs)

{
  X509 *a;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar1;
  bool bVar2;
  uchar *buf;
  size_t sVar3;
  BIO *pBVar4;
  char *pcVar5;
  PKCS12 *__p;
  pointer p12_00;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  _Var6;
  const_reference ppxVar7;
  X509 *b;
  char *in_R9;
  AssertHelper local_310;
  Message local_308;
  int local_300 [2];
  undefined1 local_2f8 [8];
  AssertionResult gtest_ar_3;
  size_t i;
  Message local_2d8;
  size_t local_2d0;
  size_type local_2c8;
  undefined1 local_2c0 [8];
  AssertionResult gtest_ar_2;
  Message local_2a8;
  int local_2a0 [2];
  undefined1 local_298 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_268;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_228;
  Message local_220;
  bool local_211;
  undefined1 local_210 [8];
  AssertionResult gtest_ar__5;
  Message local_1f8;
  int local_1f0 [2];
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1b8;
  Message local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_178;
  Message local_170;
  bool local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar__3;
  UniquePtr<struct_stack_st_X509> delete_ca_certs;
  UniquePtr<X509> delete_cert;
  UniquePtr<EVP_PKEY> delete_key;
  AssertHelper local_118;
  Message local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar__2;
  stack_st_X509 *ca_certs;
  X509 *cert;
  EVP_PKEY *key;
  AssertHelper local_b8;
  Message local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<PKCS12> p12;
  string local_88;
  AssertHelper local_68;
  Message local_60 [3];
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  UniquePtr<BIO> bio;
  vector<x509_st_*,_std::allocator<x509_st_*>_> *expect_ca_certs_local;
  X509 *expect_cert_local;
  EVP_PKEY *expect_key_local;
  Span<const_unsigned_char> in_local;
  
  in_local.data_ = (uchar *)in.size_;
  expect_key_local = (EVP_PKEY *)in.data_;
  buf = bssl::Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&expect_key_local);
  sVar3 = bssl::Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&expect_key_local);
  pBVar4 = BIO_new_mem_buf(buf,(int)sVar3);
  std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bio_st,bssl::internal::Deleter> *)&gtest_ar_.message_,(pointer)pBVar4);
  testing::AssertionResult::AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_48,
             (unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar_.message_,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar2) {
    testing::Message::Message(local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,(internal *)local_48,(AssertionResult *)0x8a2d4f,"false","true",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x20c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (!bVar2) goto LAB_004f05eb;
  pBVar4 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  __p = d2i_PKCS12_bio(pBVar4,(PKCS12 **)0x0);
  std::unique_ptr<pkcs12_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<pkcs12_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,(pointer)__p);
  testing::AssertionResult::AssertionResult<std::unique_ptr<pkcs12_st,bssl::internal::Deleter>>
            ((AssertionResult *)local_a8,
             (unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar2) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&key,(internal *)local_a8,(AssertionResult *)0x868ac5,"false","true",in_R9)
    ;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
               ,0x20f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&key);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  if (bVar2) {
    cert = (X509 *)0x0;
    ca_certs = (stack_st_X509 *)0x0;
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    p12_00 = std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::get
                       ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
    local_104 = PKCS12_parse(p12_00,"foo",(EVP_PKEY **)&cert,(X509 **)&ca_certs,
                             (stack_st_X509 **)&gtest_ar__2.message_);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_100,&local_104,(type *)0x0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar2) {
      testing::Message::Message(&local_110);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&delete_key,(internal *)local_100,
                 (AssertionResult *)"PKCS12_parse(p12.get(), kPassword, &key, &cert, &ca_certs)",
                 "false","true",in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_118,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                 ,0x214,pcVar5);
      testing::internal::AssertHelper::operator=(&local_118,&local_110);
      testing::internal::AssertHelper::~AssertHelper(&local_118);
      std::__cxx11::string::~string((string *)&delete_key);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
    if (bVar2) {
      std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)&delete_cert,(pointer)cert);
      std::unique_ptr<x509_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<x509_st,bssl::internal::Deleter> *)&delete_ca_certs,(pointer)ca_certs);
      std::unique_ptr<stack_st_X509,bssl::internal::Deleter>::
      unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<stack_st_X509,bssl::internal::Deleter> *)&gtest_ar__3.message_,
                 (pointer)gtest_ar__2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl);
      if (expect_key == (EVP_PKEY *)0x0) {
        local_161 = cert == (X509 *)0x0;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_160,&local_161,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
        if (!bVar2) {
          testing::Message::Message(&local_170);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_160,
                     (AssertionResult *)0x8f28b1,"true","false",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x21b,pcVar5);
          testing::internal::AssertHelper::operator=(&local_178,&local_170);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_170);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
LAB_004efe4d:
        if (expect_cert == (X509 *)0x0) {
          local_211 = ca_certs == (stack_st_X509 *)0x0;
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_210,&local_211,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
          if (!bVar2) {
            testing::Message::Message(&local_220);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar__6.message_,(internal *)local_210,
                       (AssertionResult *)0x8b1917,"true","false",in_R9);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_228,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                       ,0x222,pcVar5);
            testing::internal::AssertHelper::operator=(&local_228,&local_220);
            testing::internal::AssertHelper::~AssertHelper(&local_228);
            std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
            testing::Message::~Message(&local_220);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
        }
        else {
          testing::AssertionResult::AssertionResult<x509_st*>
                    ((AssertionResult *)local_258,(x509_st **)&ca_certs,(type *)0x0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
          if (!bVar2) {
            testing::Message::Message(&local_260);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_1.message_,(internal *)local_258,
                       (AssertionResult *)0x8b1917,"false","true",in_R9);
            pcVar5 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_268,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                       ,0x224,pcVar5);
            testing::internal::AssertHelper::operator=(&local_268,&local_260);
            testing::internal::AssertHelper::~AssertHelper(&local_268);
            std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
            testing::Message::~Message(&local_260);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
          if (!bVar2) goto LAB_004f05bb;
          local_2a0[1] = 0;
          local_2a0[0] = X509_cmp((X509 *)ca_certs,(X509 *)expect_cert);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_298,"0","X509_cmp(cert, expect_cert)",local_2a0 + 1,local_2a0
                    );
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
          if (!bVar2) {
            testing::Message::Message(&local_2a8);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                       ,0x225,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_2.message_,&local_2a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_2a8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
        }
        local_2c8 = std::vector<x509_st_*,_std::allocator<x509_st_*>_>::size(expect_ca_certs);
        local_2d0 = sk_X509_num((stack_st_X509 *)
                                gtest_ar__2.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl);
        testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
                  ((EqHelper *)local_2c0,"expect_ca_certs.size()","sk_X509_num(ca_certs)",&local_2c8
                   ,&local_2d0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c0);
        if (!bVar2) {
          testing::Message::Message(&local_2d8);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2c0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&i,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x228,pcVar5);
          testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_2d8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
          testing::Message::~Message(&local_2d8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c0);
        if (bVar2) {
          for (gtest_ar_3.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl =
                    (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                     )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )0x0;
              uVar1._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   gtest_ar_3.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl,
              _Var6.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )std::vector<x509_st_*,_std::allocator<x509_st_*>_>::size(expect_ca_certs),
              (ulong)uVar1._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl <
              (ulong)_Var6.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl;
              gtest_ar_3.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl =
                   (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                    )((long)gtest_ar_3.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 1)) {
            local_300[1] = 0;
            ppxVar7 = std::vector<x509_st_*,_std::allocator<x509_st_*>_>::operator[]
                                (expect_ca_certs,
                                 (size_type)
                                 gtest_ar_3.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl);
            a = (X509 *)*ppxVar7;
            b = (X509 *)sk_X509_value((stack_st_X509 *)
                                      gtest_ar__2.message_._M_t.
                                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      .
                                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                      ._M_head_impl,
                                      (size_t)gtest_ar_3.message_._M_t.
                                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              .
                                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                              ._M_head_impl);
            local_300[0] = X509_cmp(a,b);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_2f8,"0",
                       "X509_cmp(expect_ca_certs[i], sk_X509_value(ca_certs, i))",local_300 + 1,
                       local_300);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f8);
            if (!bVar2) {
              testing::Message::Message(&local_308);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_2f8);
              testing::internal::AssertHelper::AssertHelper
                        (&local_310,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                         ,0x22a,pcVar5);
              testing::internal::AssertHelper::operator=(&local_310,&local_308);
              testing::internal::AssertHelper::~AssertHelper(&local_310);
              testing::Message::~Message(&local_308);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f8);
          }
        }
      }
      else {
        testing::AssertionResult::AssertionResult<evp_pkey_st*>
                  ((AssertionResult *)local_1a8,(evp_pkey_st **)&cert,(type *)0x0);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
        if (!bVar2) {
          testing::Message::Message(&local_1b0);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar.message_,(internal *)local_1a8,(AssertionResult *)0x8f28b1,
                     "false","true",in_R9);
          pcVar5 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1b8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                     ,0x21d,pcVar5);
          testing::internal::AssertHelper::operator=(&local_1b8,&local_1b0);
          testing::internal::AssertHelper::~AssertHelper(&local_1b8);
          std::__cxx11::string::~string((string *)&gtest_ar.message_);
          testing::Message::~Message(&local_1b0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
        if (bVar2) {
          local_1f0[1] = 1;
          local_1f0[0] = EVP_PKEY_cmp((EVP_PKEY *)cert,(EVP_PKEY *)expect_key);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_1e8,"1","EVP_PKEY_cmp(key, expect_key)",local_1f0 + 1,
                     local_1f0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
          if (!bVar2) {
            testing::Message::Message(&local_1f8);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar__5.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs12_test.cc"
                       ,0x21e,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar__5.message_,&local_1f8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
            testing::Message::~Message(&local_1f8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
          goto LAB_004efe4d;
        }
      }
LAB_004f05bb:
      std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)&gtest_ar__3.message_);
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&delete_ca_certs);
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&delete_cert);
    }
  }
  std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
LAB_004f05eb:
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar_.message_);
  return;
}

Assistant:

static void ExpectPKCS12Parse(bssl::Span<const uint8_t> in,
                              EVP_PKEY *expect_key, X509 *expect_cert,
                              const std::vector<X509 *> &expect_ca_certs) {
  bssl::UniquePtr<BIO> bio(BIO_new_mem_buf(in.data(), in.size()));
  ASSERT_TRUE(bio);

  bssl::UniquePtr<PKCS12> p12(d2i_PKCS12_bio(bio.get(), nullptr));
  ASSERT_TRUE(p12);

  EVP_PKEY *key = nullptr;
  X509 *cert = nullptr;
  STACK_OF(X509) *ca_certs = nullptr;
  ASSERT_TRUE(PKCS12_parse(p12.get(), kPassword, &key, &cert, &ca_certs));

  bssl::UniquePtr<EVP_PKEY> delete_key(key);
  bssl::UniquePtr<X509> delete_cert(cert);
  bssl::UniquePtr<STACK_OF(X509)> delete_ca_certs(ca_certs);

  if (expect_key == nullptr) {
    EXPECT_FALSE(key);
  } else {
    ASSERT_TRUE(key);
    EXPECT_EQ(1, EVP_PKEY_cmp(key, expect_key));
  }

  if (expect_cert == nullptr) {
    EXPECT_FALSE(cert);
  } else {
    ASSERT_TRUE(cert);
    EXPECT_EQ(0, X509_cmp(cert, expect_cert));
  }

  ASSERT_EQ(expect_ca_certs.size(), sk_X509_num(ca_certs));
  for (size_t i = 0; i < expect_ca_certs.size(); i++) {
    EXPECT_EQ(0, X509_cmp(expect_ca_certs[i], sk_X509_value(ca_certs, i)));
  }
}